

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

P __thiscall ccs::ast::SelectorBranch::conjunction(SelectorBranch *this,P *first)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  P PVar1;
  shared_ptr<ccs::ast::BranchImpl> local_28;
  P *local_18;
  P *first_local;
  
  local_18 = first;
  first_local = (P *)this;
  std::
  make_shared<ccs::ast::BranchImpl,std::shared_ptr<ccs::ast::SelectorLeaf>&,ccs::ast::SelectorBranch::conjunction(std::shared_ptr<ccs::ast::SelectorLeaf>)::__0>
            ((shared_ptr<ccs::ast::SelectorLeaf> *)&local_28,(anon_class_1_0_00000001 *)first);
  std::shared_ptr<ccs::ast::SelectorBranch>::shared_ptr<ccs::ast::BranchImpl,void>
            ((shared_ptr<ccs::ast::SelectorBranch> *)this,&local_28);
  std::shared_ptr<ccs::ast::BranchImpl>::~shared_ptr(&local_28);
  PVar1.super___shared_ptr<ccs::ast::SelectorBranch,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar1.super___shared_ptr<ccs::ast::SelectorBranch,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (P)PVar1.super___shared_ptr<ccs::ast::SelectorBranch,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SelectorBranch::P SelectorBranch::conjunction(SelectorLeaf::P first) {
  return std::make_shared<BranchImpl>(first, [](SelectorLeaf &first,
              BuildContext::P context, BuildContext::P baseContext) {
    return context->conjunction(context->traverse(first), baseContext);
  });
}